

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

utf16 __thiscall GrcFont::FirstFreeGlyph(GrcFont *this)

{
  unsigned_long *puVar1;
  void *in_RDI;
  size_t suTest;
  size_t suMaxGlyf;
  size_t local_18;
  
  local_18 = TtfUtil::GlyphCount(in_RDI);
  puVar1 = std::max<unsigned_long>((unsigned_long *)&stack0xfffffffffffffff0,&local_18);
  local_18 = TtfUtil::LocaGlyphCount((size_t)in_RDI,(void *)*puVar1);
  puVar1 = std::max<unsigned_long>((unsigned_long *)&stack0xfffffffffffffff0,&local_18);
  return (utf16)*puVar1;
}

Assistant:

utf16 GrcFont::FirstFreeGlyph()
{
#ifdef _DEBUG
	if (m_fDebug)
		//return 0x2200;
		return 0x0200;	// iucdemo
#endif

	Assert(m_pFile); // insure Init() called first
	Assert(m_nMaxGlyfId != -1);  // insure ScanGlyfIds() called
	Assert(m_pMaxp);
	Assert(m_pHead);
	
	size_t suMaxGlyf = 	m_nMaxGlyfId + 1; // assuming glyf ids start at zero

	size_t suTest = TtfUtil::GlyphCount(m_pMaxp);
	suMaxGlyf = max(suMaxGlyf, suTest);

	suTest = TtfUtil::LocaGlyphCount(m_cLoca, m_pHead); // could return -1
	suMaxGlyf = max(suMaxGlyf, suTest);

	return (utf16)suMaxGlyf;
}